

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O0

void Gia_FormStrTransform(char *pStr,char *pForm)

{
  int local_20;
  int local_1c;
  int k;
  int i;
  char *pForm_local;
  char *pStr_local;
  
  local_1c = 0;
  local_20 = 0;
  do {
    if (pForm[local_1c] == '\0') {
      pStr[local_20] = '\0';
      return;
    }
    if (pForm[local_1c] == '~') {
      local_1c = local_1c + 1;
      if ((pForm[local_1c] < 'a') || ('z' < pForm[local_1c])) {
        __assert_fail("pForm[i] >= \'a\' && pForm[i] <= \'z\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcFault.c"
                      ,0x208,"void Gia_FormStrTransform(char *, char *)");
      }
      pStr[local_20] = pForm[local_1c] + -0x20;
    }
    else {
      pStr[local_20] = pForm[local_1c];
    }
    local_20 = local_20 + 1;
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

void Gia_FormStrTransform( char * pStr, char * pForm )
{
    int i, k;
    for ( k = i = 0; pForm[i]; i++ )
    {
        if ( pForm[i] == '~' )
        {
            i++;
            assert( pForm[i] >= 'a' && pForm[i] <= 'z' );
            pStr[k++] = 'A' + pForm[i] - 'a';
        }
        else
            pStr[k++] = pForm[i];
    }
    pStr[k] = 0; 
}